

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O2

char * put_font_size(char *n,int size)

{
  char *name;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *__ptr;
  char *pcVar6;
  char *pcVar7;
  long lVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  int n_1;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int local_474;
  int cnt;
  char local_438 [1032];
  size_t sVar8;
  
  __ptr = strdup(n);
  iVar17 = 1;
  pcVar12 = __ptr;
  do {
    if (*pcVar12 == ',') {
      iVar17 = iVar17 + 1;
      *pcVar12 = '\0';
    }
    else if (*pcVar12 == '\0') {
      pcVar6 = (char *)malloc((long)(iVar17 << 8));
      *pcVar6 = '\0';
      iVar11 = 0;
      pcVar12 = __ptr;
      do {
        lVar15 = (long)iVar11;
        if (iVar17 < 1) {
          pcVar6[lVar15] = '\0';
          free(__ptr);
          return pcVar6;
        }
        if (find_best_font(char_const*,int)::list != (long *)0x0) {
          XFreeFontNames();
        }
        find_best_font(char_const*,int)::list = (long *)XListFonts(fl_display,pcVar12,100);
        pcVar13 = "fixed";
        if (find_best_font(char_const*,int)::list != (long *)0x0) {
          pcVar13 = (char *)*find_best_font(char_const*,int)::list;
          uVar1 = -cnt;
          if (0 < cnt) {
            uVar1 = cnt;
          }
          local_474 = 0x7fff;
          bVar2 = false;
          iVar5 = 0;
          for (uVar14 = 0; uVar14 != uVar1; uVar14 = uVar14 + 1) {
            name = (char *)find_best_font(char_const*,int)::list[uVar14];
            iVar3 = fl_correct_encoding(name);
            if (iVar3 == 0) {
              if (!bVar2) {
                bVar2 = false;
                goto LAB_001e7145;
              }
              bVar2 = true;
LAB_001e7175:
              name = pcVar13;
              iVar10 = iVar5;
              iVar4 = local_474;
            }
            else {
              if (!bVar2) {
                iVar5 = 0;
              }
              bVar2 = true;
LAB_001e7145:
              pcVar7 = fl_find_fontsize(name);
              if (pcVar7 == (char *)0x0) {
                iVar3 = 0x7fff;
              }
              else {
                iVar3 = atoi(pcVar7);
              }
              sVar8 = strlen(name);
              iVar4 = (int)sVar8;
              iVar10 = size;
              if ((iVar3 != size) || (local_474 <= iVar4)) {
                if ((iVar3 == 0) && (iVar5 != size)) {
                  iVar3 = (int)pcVar7 - (int)name;
                  memcpy(local_438,name,(long)iVar3);
                  iVar5 = sprintf(local_438 + iVar3,"%d",(ulong)(uint)size);
                  pcVar7 = pcVar7 + -1;
                  do {
                    pcVar13 = pcVar7 + 1;
                    pcVar7 = pcVar7 + 1;
                  } while (*pcVar13 == '0');
                  strcpy(local_438 + (iVar5 + iVar3),pcVar7);
                  name = local_438;
                  iVar4 = local_474;
                }
                else {
                  iVar10 = iVar3;
                  if ((iVar5 != 0) &&
                     (((iVar5 <= size || (iVar5 <= iVar3)) && (size < iVar3 || iVar3 <= iVar5))))
                  goto LAB_001e7175;
                }
              }
            }
            pcVar13 = name;
            local_474 = iVar4;
            iVar5 = iVar10;
          }
        }
        lVar16 = lVar15 << 0x20;
        for (lVar9 = 0; pcVar13[lVar9] != '\0'; lVar9 = lVar9 + 1) {
          pcVar6[lVar9 + lVar15] = pcVar13[lVar9];
          lVar16 = lVar16 + 0x100000000;
          iVar11 = iVar11 + 1;
        }
        do {
          pcVar13 = pcVar12;
          pcVar12 = pcVar13 + 1;
        } while (*pcVar13 != '\0');
        iVar17 = iVar17 + -1;
        if (iVar17 != 0) {
          pcVar6[lVar16 >> 0x20] = ',';
          iVar11 = iVar11 + 1;
          pcVar13 = pcVar13 + 1;
        }
        pcVar12 = pcVar13 + -1;
        do {
          pcVar13 = pcVar12 + 1;
          pcVar12 = pcVar12 + 1;
          iVar5 = isspace((int)*pcVar13);
        } while (iVar5 != 0);
      } while( true );
    }
    pcVar12 = pcVar12 + 1;
  } while( true );
}

Assistant:

static char *put_font_size(const char *n, int size)
{
        int i = 0;
        char *buf;
        const char *ptr;
        const char *f;
        char *name;
        int nbf = 1;
        name = strdup(n);
        while (name[i]) {
                if (name[i] == ',') {nbf++; name[i] = '\0';}
                i++;
        }

        buf = (char*) malloc(nbf * 256);
        buf[0] = '\0';
        ptr = name;
        i = 0;
        while (ptr && nbf > 0) {
                f = find_best_font(ptr, size);
                while (*f) {
                        buf[i] = *f;
                        f++; i++;
                }
                nbf--;
                while (*ptr) ptr++;
                if (nbf) {
                        ptr++;
                        buf[i] = ',';
                        i++;
                }
                while(isspace(*ptr)) ptr++;
        }
        buf[i] = '\0';
        free(name);
        return buf;
}